

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_BrepFace * __thiscall
ON_ObjectArray<ON_BrepFace>::Realloc
          (ON_ObjectArray<ON_BrepFace> *this,ON_BrepFace *ptr,int capacity)

{
  ON_BrepFace *pOVar1;
  long lVar2;
  ON_BrepFace *pOVar3;
  
  pOVar1 = (ON_BrepFace *)onrealloc(ptr,(long)capacity * 0xd8);
  if ((((ptr != (ON_BrepFace *)0x0) && (pOVar1 != (ON_BrepFace *)0x0)) && (pOVar1 != ptr)) &&
     (0 < (this->super_ON_ClassArray<ON_BrepFace>).m_count)) {
    lVar2 = 0;
    pOVar3 = pOVar1;
    do {
      (*(pOVar3->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[5])(pOVar3);
      lVar2 = lVar2 + 1;
      pOVar3 = pOVar3 + 1;
    } while (lVar2 < (this->super_ON_ClassArray<ON_BrepFace>).m_count);
  }
  return pOVar1;
}

Assistant:

T* ON_ObjectArray<T>::Realloc(T* ptr,int capacity)
{
  T* reptr = (T*)onrealloc(ptr,capacity*sizeof(T));
  if ( ptr && reptr && reptr != ptr )
  {
    // The "this->" in this->m_count and this->m_a 
    // are needed for gcc 4 to compile.
    int i;
    for ( i = 0; i < this->m_count; i++ )
    {
      reptr[i].MemoryRelocate();
    }
  }
  return reptr;
}